

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

void __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::BuildRun
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          idx_t level_idx,idx_t run_idx)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  reference pvVar7;
  const_reference pvVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  bool bVar12;
  ulong uVar13;
  size_type __n;
  size_type __n_00;
  ulong uVar14;
  unsigned_long uVar15;
  idx_t i;
  size_type __n_01;
  unsigned_long *puVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  RunElement RVar20;
  RunElement SENTINEL;
  array<std::pair<unsigned_int,_unsigned_int>,_32UL> bounds;
  Games games;
  RunElements players;
  RunElement local_558;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *local_548;
  ulong local_540;
  reference local_538;
  ulong local_530;
  reference local_528;
  value_type local_520 [64];
  Games local_420;
  RunElements local_230;
  
  pvVar4 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
           ::operator[](&this->tree,level_idx);
  pvVar5 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
           ::operator[](&this->tree,level_idx);
  __n_01 = level_idx - 1;
  local_548 = this;
  local_538 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
              ::operator[](&this->tree,__n_01);
  if (level_idx < 2) {
    local_540 = 1;
    uVar18 = 0x20;
  }
  else {
    uVar18 = 0x20;
    do {
      local_540 = uVar18;
      uVar18 = local_540 << 5;
      __n_01 = __n_01 - 1;
    } while (__n_01 != 0);
  }
  uVar13 = (long)(pvVar4->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar4->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  local_558.first = 0xffffffff;
  local_558.second = 0xffffffffffffffff;
  local_528 = pvVar4;
  switchD_012e3010::default(local_520,0,0x100);
  lVar6 = 8;
  do {
    *(undefined4 *)((long)local_230._M_elems + lVar6 + -8) = 0;
    *(undefined8 *)((long)&local_230._M_elems[0].first + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x208);
  __n = uVar18 * run_idx;
  puVar16 = &local_230._M_elems[0].second;
  uVar15 = 0;
  uVar9 = local_540;
  __n_00 = __n;
  local_530 = uVar18;
  do {
    uVar18 = uVar13;
    if (__n_00 < uVar13) {
      uVar18 = __n_00;
    }
    uVar14 = uVar9 + __n_00;
    uVar10 = uVar13;
    if (uVar14 < uVar13) {
      uVar10 = uVar14;
    }
    local_520[uVar15 * 2] = (value_type)uVar18;
    local_520[uVar15 * 2 + 1] = (value_type)uVar10;
    if ((value_type)uVar18 == (value_type)uVar10) {
      vVar2 = 0xffffffff;
      uVar11 = 0xffffffffffffffff;
    }
    else {
      pvVar8 = vector<unsigned_int,_true>::operator[](&local_538->first,__n_00);
      vVar2 = *pvVar8;
      uVar11 = uVar15;
      uVar9 = local_540;
    }
    ((pair<unsigned_int,_unsigned_long> *)(puVar16 + -1))->first = vVar2;
    *puVar16 = uVar11;
    uVar15 = uVar15 + 1;
    puVar16 = puVar16 + 2;
    __n_00 = uVar14;
  } while (uVar15 != 0x20);
  lVar6 = 8;
  do {
    *(undefined4 *)((long)local_520 + lVar6 + 0xf8) = 0;
    *(undefined8 *)((long)&local_420._M_elems[0].first + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x1f8);
  lVar6 = run_idx * ((local_530 >> 5) + 2) * 0x20;
  RVar20 = StartGames(local_548,&local_420,&local_230,&local_558);
  uVar18 = RVar20.second;
  vVar2 = RVar20.first;
  if ((vVar2 != local_558.first) || (uVar18 != local_558.second)) {
    do {
      if (((pvVar5->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pvVar5->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish) && ((__n & 0x1f) == 0)) {
        lVar17 = 0;
        do {
          vVar1 = local_520[lVar17 * 2];
          pvVar7 = vector<unsigned_int,_true>::operator[](&pvVar5->second,lVar6 + lVar17);
          *pvVar7 = vVar1;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x20);
        lVar6 = lVar6 + 0x20;
      }
      pvVar7 = vector<unsigned_int,_true>::operator[](&local_528->first,__n);
      *pvVar7 = vVar2;
      uVar3 = local_520[uVar18 * 2] + 1;
      local_520[uVar18 * 2] = uVar3;
      if (uVar3 < local_520[uVar18 * 2 + 1]) {
        pvVar8 = vector<unsigned_int,_true>::operator[](&local_538->first,(ulong)uVar3);
        vVar2 = *pvVar8;
        uVar13 = uVar18 + 0x1e;
        do {
          uVar9 = uVar13 >> 1;
          uVar3 = local_420._M_elems[uVar9].first;
          if (uVar3 < vVar2) {
            uVar14 = local_420._M_elems[uVar9].second;
LAB_011bd536:
            local_420._M_elems[uVar9].first = vVar2;
            local_420._M_elems[uVar9].second = uVar18;
            uVar18 = uVar14;
            vVar2 = uVar3;
          }
          else if ((uVar3 <= vVar2) && (uVar14 = local_420._M_elems[uVar9].second, uVar14 < uVar18))
          goto LAB_011bd536;
          bVar19 = 1 < uVar13;
          uVar13 = uVar9 - 1;
        } while (bVar19);
      }
      else {
        uVar13 = uVar18 + 0x1e;
        uVar18 = local_558.second;
        vVar2 = local_558.first;
        do {
          uVar9 = uVar13 >> 1;
          uVar3 = local_420._M_elems[uVar9].first;
          if (uVar3 < vVar2) {
            uVar14 = local_420._M_elems[uVar9].second;
LAB_011bd59d:
            local_420._M_elems[uVar9].first = vVar2;
            local_420._M_elems[uVar9].second = uVar18;
            uVar18 = uVar14;
            vVar2 = uVar3;
          }
          else if ((uVar3 <= vVar2) && (uVar14 = local_420._M_elems[uVar9].second, uVar14 < uVar18))
          goto LAB_011bd59d;
          bVar19 = 1 < uVar13;
          uVar13 = uVar9 - 1;
        } while (bVar19);
      }
      __n = __n + 1;
    } while ((vVar2 != local_558.first) || (uVar18 != local_558.second));
  }
  if ((pvVar5->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pvVar5->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar19 = true;
    do {
      bVar12 = bVar19;
      lVar17 = 0;
      do {
        vVar2 = local_520[lVar17 * 2];
        pvVar7 = vector<unsigned_int,_true>::operator[](&pvVar5->second,lVar6 + lVar17);
        *pvVar7 = vVar2;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x20);
      lVar6 = lVar6 + 0x20;
      bVar19 = false;
    } while (bVar12);
  }
  LOCK();
  (local_548->build_complete).super___atomic_base<unsigned_long>._M_i =
       (local_548->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}